

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int ptls_build_certificate_message
              (ptls_buffer_t *buf,ptls_iovec_t context,ptls_iovec_t *certificates,
              size_t num_certificates,ptls_iovec_t ocsp_status)

{
  size_t sVar1;
  uint8_t *puVar2;
  size_t sVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  long lVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t local_78;
  
  iVar4 = ptls_buffer_reserve_aligned(buf,1,'\0');
  if (iVar4 == 0) {
    buf->base[buf->off] = '\0';
    sVar1 = buf->off;
    sVar10 = sVar1 + 1;
    buf->off = sVar10;
    iVar4 = ptls_buffer__do_pushv(buf,context.base,context.len);
    if (iVar4 == 0) {
      uVar5 = buf->off - sVar10;
      iVar4 = 0x20c;
      if (uVar5 < 0x100) {
        buf->base[sVar1] = (uint8_t)uVar5;
        iVar4 = ptls_buffer_reserve_aligned(buf,3,'\0');
        if (iVar4 == 0) {
          puVar2 = buf->base;
          sVar1 = buf->off;
          puVar2[sVar1 + 2] = '\0';
          puVar2 = puVar2 + sVar1;
          puVar2[0] = '\0';
          puVar2[1] = '\0';
          sVar10 = buf->off;
          sVar1 = sVar10 + 3;
          buf->off = sVar1;
          sVar8 = sVar1;
          if (num_certificates != 0) {
            local_78 = 0;
            do {
              iVar4 = ptls_buffer_reserve_aligned(buf,3,'\0');
              if (iVar4 != 0) {
                return iVar4;
              }
              puVar2 = buf->base;
              sVar8 = buf->off;
              puVar2[sVar8 + 2] = '\0';
              puVar2 = puVar2 + sVar8;
              puVar2[0] = '\0';
              puVar2[1] = '\0';
              sVar8 = buf->off;
              buf->off = sVar8 + 3;
              iVar4 = ptls_buffer__do_pushv
                                (buf,certificates[local_78].base,certificates[local_78].len);
              if (iVar4 != 0) {
                return iVar4;
              }
              uVar5 = buf->off - (sVar8 + 3);
              if (0xffffff < uVar5) {
                return 0x20c;
              }
              lVar7 = 0x10;
              do {
                buf->base[sVar8] = (uint8_t)(uVar5 >> ((byte)lVar7 & 0x3f));
                lVar7 = lVar7 + -8;
                sVar8 = sVar8 + 1;
              } while (lVar7 != -8);
              iVar4 = ptls_buffer_reserve_aligned(buf,2,'\0');
              if (iVar4 != 0) {
                return iVar4;
              }
              puVar2 = buf->base;
              sVar8 = buf->off;
              (puVar2 + sVar8)[0] = '\0';
              (puVar2 + sVar8)[1] = '\0';
              sVar3 = buf->off;
              sVar8 = sVar3 + 2;
              buf->off = sVar8;
              sVar6 = sVar8;
              if (local_78 == 0 && ocsp_status.len != 0) {
                iVar4 = ptls_buffer_reserve_aligned(buf,2,'\0');
                if (iVar4 != 0) {
                  return iVar4;
                }
                puVar2 = buf->base;
                sVar6 = buf->off;
                (puVar2 + sVar6)[0] = '\0';
                (puVar2 + sVar6)[1] = '\x05';
                buf->off = buf->off + 2;
                iVar4 = ptls_buffer_reserve_aligned(buf,2,'\0');
                if (iVar4 != 0) {
                  return iVar4;
                }
                puVar2 = buf->base;
                sVar6 = buf->off;
                (puVar2 + sVar6)[0] = '\0';
                (puVar2 + sVar6)[1] = '\0';
                sVar6 = buf->off;
                buf->off = sVar6 + 2;
                iVar4 = ptls_buffer_reserve_aligned(buf,1,'\0');
                if (iVar4 != 0) {
                  return iVar4;
                }
                buf->base[buf->off] = '\x01';
                buf->off = buf->off + 1;
                iVar4 = ptls_buffer_reserve_aligned(buf,3,'\0');
                if (iVar4 != 0) {
                  return iVar4;
                }
                puVar2 = buf->base;
                sVar9 = buf->off;
                puVar2[sVar9 + 2] = '\0';
                puVar2 = puVar2 + sVar9;
                puVar2[0] = '\0';
                puVar2[1] = '\0';
                sVar9 = buf->off;
                buf->off = sVar9 + 3;
                iVar4 = ptls_buffer__do_pushv(buf,ocsp_status.base,ocsp_status.len);
                if (iVar4 != 0) {
                  return iVar4;
                }
                uVar5 = buf->off - (sVar9 + 3);
                if (0xffffff < uVar5) {
                  return 0x20c;
                }
                lVar7 = 0x10;
                do {
                  buf->base[sVar9] = (uint8_t)(uVar5 >> ((byte)lVar7 & 0x3f));
                  lVar7 = lVar7 + -8;
                  sVar9 = sVar9 + 1;
                } while (lVar7 != -8);
                uVar5 = buf->off - (sVar6 + 2);
                if (0xffff < uVar5) {
                  return 0x20c;
                }
                buf->base[sVar6] = (uint8_t)(uVar5 >> 8);
                buf->base[sVar6 + 1] = (uint8_t)uVar5;
                sVar6 = buf->off;
              }
              uVar5 = sVar6 - sVar8;
              if (0xffff < uVar5) {
                return 0x20c;
              }
              buf->base[sVar3] = (uint8_t)(uVar5 >> 8);
              buf->base[sVar3 + 1] = (uint8_t)uVar5;
              local_78 = local_78 + 1;
            } while (local_78 != num_certificates);
            sVar8 = buf->off;
          }
          iVar4 = 0x20c;
          if (sVar8 - sVar1 < 0x1000000) {
            lVar7 = 0x10;
            iVar4 = 0;
            do {
              buf->base[sVar10] = (uint8_t)(sVar8 - sVar1 >> ((byte)lVar7 & 0x3f));
              lVar7 = lVar7 + -8;
              sVar10 = sVar10 + 1;
            } while (lVar7 != -8);
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int ptls_build_certificate_message(ptls_buffer_t *buf, ptls_iovec_t context, ptls_iovec_t *certificates, size_t num_certificates,
                                   ptls_iovec_t ocsp_status)
{
    int ret;

    ptls_buffer_push_block(buf, 1, { ptls_buffer_pushv(buf, context.base, context.len); });
    ptls_buffer_push_block(buf, 3, {
        size_t i;
        for (i = 0; i != num_certificates; ++i) {
            ptls_buffer_push_block(buf, 3, { ptls_buffer_pushv(buf, certificates[i].base, certificates[i].len); });
            ptls_buffer_push_block(buf, 2, {
                if (i == 0 && ocsp_status.len != 0) {
                    buffer_push_extension(buf, PTLS_EXTENSION_TYPE_STATUS_REQUEST, {
                        ptls_buffer_push(buf, 1); /* status_type == ocsp */
                        ptls_buffer_push_block(buf, 3, { ptls_buffer_pushv(buf, ocsp_status.base, ocsp_status.len); });
                    });
                }
            });
        }
    });

    ret = 0;
Exit:
    return ret;
}